

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  BYTE **ppBVar1;
  ushort uVar2;
  void *pvVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  BYTE *pBVar12;
  BYTE *ip [4];
  BYTE *op [4];
  U64 bits [4];
  
  pvVar3 = args->dt;
  pBVar4 = args->oend;
  pBVar5 = args->ilimit;
  bits[2] = args->bits[2];
  bits[3] = args->bits[3];
  bits[0] = args->bits[0];
  bits[1] = args->bits[1];
  ip[0] = args->ip[0];
  ip[1] = args->ip[1];
  ip[2] = args->ip[2];
  ip[3] = args->ip[3];
  op[0] = args->op[0];
  op[1] = args->op[1];
  op[2] = args->op[2];
  op[3] = args->op[3];
  lVar10 = 0;
  while( true ) {
    while (lVar10 != 4) {
      pBVar12 = pBVar4;
      if (lVar10 != 3) {
        pBVar12 = op[lVar10 + 1];
      }
      if (pBVar12 < op[lVar10]) {
        __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8eff,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      ppBVar1 = ip + lVar10;
      lVar10 = lVar10 + 1;
      if (*ppBVar1 < pBVar5) {
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f00,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
    }
    uVar8 = (ulong)((long)pBVar4 - (long)op[3]) / 5;
    uVar9 = (ulong)((long)ip[0] - (long)pBVar5) / 7;
    if (uVar8 < uVar9) {
      uVar9 = uVar8;
    }
    if (((((long)(uVar9 * 5) < 0x14) || (ip[1] < ip[0])) || (ip[2] < ip[1])) || (ip[3] < ip[2]))
    break;
    if (((ip[1] < ip[0]) || (ip[2] < ip[1])) || (ip[3] < ip[2])) {
      __assert_fail("ip[stream] >= ip[stream - 1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f25,
                    "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                   );
    }
    pBVar12 = op[3] + uVar9 * 5;
    lVar11 = 0;
    do {
      for (; lVar11 != 5; lVar11 = lVar11 + 1) {
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          uVar2 = *(ushort *)((long)pvVar3 + (bits[lVar10] >> 0x35) * 2);
          bits[lVar10] = bits[lVar10] << ((ulong)uVar2 & 0x3f);
          op[lVar10][lVar11] = (BYTE)(uVar2 >> 8);
        }
      }
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        uVar7 = 0;
        for (uVar9 = bits[lVar10]; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        op[lVar10] = op[lVar10] + 5;
        pBVar6 = ip[lVar10];
        ip[lVar10] = pBVar6 + -(ulong)(uVar7 >> 3);
        bits[lVar10] = (*(ulong *)(pBVar6 + -(ulong)(uVar7 >> 3)) | 1) << ((byte)uVar7 & 7);
      }
      lVar10 = 0;
      lVar11 = 0;
    } while (op[3] < pBVar12);
  }
  args->bits[2] = bits[2];
  args->bits[3] = bits[3];
  args->bits[0] = bits[0];
  args->bits[1] = bits[1];
  args->ip[2] = ip[2];
  args->ip[3] = ip[3];
  args->ip[0] = ip[0];
  args->ip[1] = ip[1];
  args->op[2] = op[2];
  args->op[3] = op[3];
  args->op[0] = op[0];
  args->op[1] = op[1];
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilimit) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we get close to the end. */
            if (op[3] + 20 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Decode 5 symbols in each of the 4 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 4; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    int const entry = (int)dtable[index];
                    bits[stream] <<= (entry & 63);
                    op[stream][symbol] = (BYTE)((entry >> 8) & 0xFF);
                }
            }
            /* Reload the bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                int const nbBits = ctz & 7;
                int const nbBytes = ctz >> 3;
                op[stream] += 5;
                ip[stream] -= nbBytes;
                bits[stream] = MEM_read64(ip[stream]) | 1;
                bits[stream] <<= nbBits;
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}